

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Float __thiscall pbrt::Image::GetChannel(Image *this,Point2i p,int c,WrapMode2D wrapMode)

{
  PixelFormat PVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  span<const_unsigned_char> vin;
  span<float> vout;
  Point2i p_local;
  Float r;
  
  p_local = p;
  bVar2 = RemapPixelCoords(&p_local,(Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                           wrapMode);
  fVar5 = 0.0;
  if (bVar2) {
    PVar1 = this->format;
    iVar3 = p_local.super_Tuple2<pbrt::Point2,_int>.x;
    iVar4 = p_local.super_Tuple2<pbrt::Point2,_int>.y;
    if (PVar1 == Float) {
      fVar5 = (this->p32).ptr
              [(long)((iVar4 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar3) *
                     (int)(this->channelNames).nStored) + (long)c];
    }
    else if (PVar1 == Half) {
      fVar5 = Half::operator_cast_to_float
                        ((this->p16).ptr +
                         (long)((iVar4 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
                                iVar3) * (int)(this->channelNames).nStored) + (long)c);
    }
    else {
      if (PVar1 != U256) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h"
                 ,0x110,"Unhandled PixelFormat");
      }
      vin.ptr = (this->p8).ptr +
                (long)c + (long)((iVar4 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
                                 iVar3) * (int)(this->channelNames).nStored);
      vin.n = 1;
      vout.n = 1;
      vout.ptr = &r;
      ColorEncodingHandle::ToLinear(&this->encoding,vin,vout);
      fVar5 = r;
    }
  }
  return fVar5;
}

Assistant:

PBRT_CPU_GPU
    Float GetChannel(Point2i p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        if (!RemapPixelCoords(&p, resolution, wrapMode))
            return 0;

        switch (format) {
        case PixelFormat::U256: {
            Float r;
            encoding.ToLinear({&p8[PixelOffset(p) + c], 1}, {&r, 1});
            return r;
        }
        case PixelFormat::Half:
            return Float(p16[PixelOffset(p) + c]);
        case PixelFormat::Float:
            return p32[PixelOffset(p) + c];
        default:
            LOG_FATAL("Unhandled PixelFormat");
            return 0;
        }
    }